

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Sched.c
# Opt level: O2

void Llb_MtrSwapColumns(Llb_Mtr_t *p,int iCol1,int iCol2)

{
  int iVar1;
  Llb_Grp_t **ppLVar2;
  Llb_Grp_t *pLVar3;
  char **ppcVar4;
  int *piVar5;
  uint __line;
  char *pcVar6;
  
  if ((iCol1 < 0) || (p->nCols <= iCol1)) {
    pcVar6 = "iCol1 >= 0 && iCol1 < p->nCols";
    __line = 0x32;
  }
  else {
    if ((-1 < iCol2) && (iCol2 < p->nCols)) {
      if (iCol1 != iCol2) {
        ppLVar2 = p->pColGrps;
        pLVar3 = ppLVar2[(uint)iCol1];
        ppLVar2[(uint)iCol1] = ppLVar2[(uint)iCol2];
        p->pColGrps[(uint)iCol2] = pLVar3;
        ppcVar4 = p->pMatrix;
        pcVar6 = ppcVar4[(uint)iCol1];
        ppcVar4[(uint)iCol1] = ppcVar4[(uint)iCol2];
        p->pMatrix[(uint)iCol2] = pcVar6;
        piVar5 = p->pColSums;
        iVar1 = piVar5[(uint)iCol1];
        piVar5[(uint)iCol1] = piVar5[(uint)iCol2];
        piVar5[(uint)iCol2] = iVar1;
      }
      return;
    }
    pcVar6 = "iCol2 >= 0 && iCol2 < p->nCols";
    __line = 0x33;
  }
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Sched.c"
                ,__line,"void Llb_MtrSwapColumns(Llb_Mtr_t *, int, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Swaps two rows.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Llb_MtrSwapColumns( Llb_Mtr_t * p, int iCol1, int iCol2 )
{
    Llb_Grp_t * pGemp;
    char * pTemp;
    int iTemp;
    assert( iCol1 >= 0 && iCol1 < p->nCols );
    assert( iCol2 >= 0 && iCol2 < p->nCols );
    if ( iCol1 == iCol2 )
        return;
    assert( iCol1 != iCol2 );
    // swap col groups
    pGemp = p->pColGrps[iCol1];
    p->pColGrps[iCol1] = p->pColGrps[iCol2];
    p->pColGrps[iCol2] = pGemp;
    // swap col vectors
    pTemp = p->pMatrix[iCol1];
    p->pMatrix[iCol1] = p->pMatrix[iCol2];
    p->pMatrix[iCol2] = pTemp;
    // swap col sums
    iTemp = p->pColSums[iCol1];
    p->pColSums[iCol1] = p->pColSums[iCol2];
    p->pColSums[iCol2] = iTemp;
}